

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  uchar *puVar11;
  uchar *puVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  byte bVar20;
  uint uVar21;
  uchar *puVar23;
  uchar *puVar24;
  uchar *puVar25;
  ulong uVar19;
  ulong uVar22;
  
  if (h == 0) {
    return 0;
  }
  uVar5 = bpp + 7;
  uVar17 = uVar5 >> 3;
  uVar19 = (ulong)uVar17;
  uVar10 = w * bpp + 7;
  uVar21 = uVar10 >> 3;
  uVar22 = (ulong)uVar21;
  lVar1 = uVar22 + 1;
  puVar11 = in + 1;
  lVar16 = uVar22 - uVar19;
  puVar25 = out + uVar19;
  puVar23 = in + uVar19 + 1;
  uVar14 = 0;
  puVar24 = (uchar *)0x0;
  uVar7 = (ulong)h;
  puVar12 = out;
  do {
    switch(in[lVar1 * uVar14]) {
    case '\0':
      uVar8 = 0;
      bVar4 = true;
      if (7 < uVar10) {
        uVar8 = 0;
        do {
          puVar12[uVar8] = puVar11[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar22 != uVar8);
        goto LAB_0010ff28;
      }
      break;
    case '\x01':
      if (7 < uVar5) {
        uVar8 = 0;
        do {
          puVar12[uVar8] = puVar11[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar19 != uVar8);
      }
      if (uVar17 < uVar21) {
        lVar13 = 0;
        do {
          puVar25[lVar13] = puVar12[lVar13] + puVar23[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar16 != lVar13);
      }
      goto LAB_0010ff28;
    case '\x02':
      uVar8 = 0;
      if (puVar24 == (uchar *)0x0) {
        bVar4 = true;
        if (uVar10 < 8) break;
        uVar8 = 0;
        do {
          puVar12[uVar8] = puVar11[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar22 != uVar8);
      }
      else if (7 < uVar10) {
        uVar8 = 0;
        do {
          puVar12[uVar8] = puVar24[uVar8] + puVar11[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar22 != uVar8);
      }
LAB_0010ff28:
      uVar8 = 0;
      bVar4 = true;
      break;
    case '\x03':
      if (puVar24 != (uchar *)0x0) {
        if (7 < uVar5) {
          uVar8 = 0;
          do {
            puVar12[uVar8] = (puVar24[uVar8] >> 1) + puVar11[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar19 != uVar8);
        }
        if (uVar17 < uVar21) {
          lVar13 = 0;
          do {
            puVar25[lVar13] =
                 (char)((uint)puVar24[lVar13 + uVar19] + (uint)puVar12[lVar13] >> 1) +
                 puVar23[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar16 != lVar13);
        }
        goto LAB_0010ff28;
      }
      if (7 < uVar5) {
        uVar8 = 0;
        do {
          puVar12[uVar8] = puVar11[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar19 != uVar8);
      }
      if (uVar17 < uVar21) {
        lVar13 = 0;
        do {
          puVar25[lVar13] = (puVar12[lVar13] >> 1) + puVar23[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar16 != lVar13);
        goto LAB_0010ff96;
      }
LAB_0010ff9e:
      uVar8 = 0;
      bVar4 = true;
      break;
    case '\x04':
      if (puVar24 != (uchar *)0x0) {
        if (7 < uVar5) {
          uVar8 = 0;
          do {
            puVar12[uVar8] = puVar24[uVar8] + puVar11[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar19 != uVar8);
        }
        if (uVar17 < uVar21) {
          lVar13 = 0;
          do {
            bVar2 = puVar12[lVar13];
            bVar9 = puVar24[lVar13 + uVar19];
            bVar20 = puVar24[lVar13];
            uVar6 = (uint)bVar9 - (uint)bVar20;
            uVar3 = -uVar6;
            if (0 < (int)uVar6) {
              uVar3 = uVar6;
            }
            uVar18 = (uint)bVar2 - (uint)bVar20;
            uVar6 = -uVar18;
            if (0 < (int)uVar18) {
              uVar6 = uVar18;
            }
            uVar15 = (uint)bVar9 + (uint)bVar2 + (uint)bVar20 * -2;
            uVar18 = -uVar15;
            if (0 < (int)uVar15) {
              uVar18 = uVar15;
            }
            if ((uVar3 & 0xff) <= (uVar6 & 0xff)) {
              bVar9 = bVar2;
            }
            if ((uVar6 & 0xff) <= (uVar18 & 0xffff)) {
              bVar20 = bVar9;
            }
            if ((uVar3 & 0xff) <= (uVar18 & 0xffff)) {
              bVar20 = bVar9;
            }
            puVar25[lVar13] = bVar20 + puVar23[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar16 != lVar13);
        }
        goto LAB_0010ff28;
      }
      if (7 < uVar5) {
        uVar8 = 0;
        do {
          puVar12[uVar8] = puVar11[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar19 != uVar8);
      }
      if (uVar21 <= uVar17) goto LAB_0010ff9e;
      lVar13 = 0;
      do {
        puVar25[lVar13] = puVar12[lVar13] + puVar23[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar16 != lVar13);
LAB_0010ff96:
      bVar4 = true;
      uVar8 = 0;
      break;
    default:
      bVar4 = false;
      uVar8 = 0x24;
    }
    if (!bVar4) {
      uVar7 = uVar8;
    }
    if (!bVar4) {
      return (uint)uVar7;
    }
    puVar24 = out + uVar14 * uVar22;
    uVar14 = uVar14 + 1;
    puVar12 = puVar12 + uVar22;
    puVar11 = puVar11 + lVar1;
    puVar25 = puVar25 + uVar22;
    puVar23 = puVar23 + lVar1;
    if (uVar14 == h) {
      return 0;
    }
  } while( true );
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp)
{
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  size_t linebytes = (w * bpp + 7) / 8;

  for(y = 0; y < h; ++y)
  {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}